

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

ostream * rtosc::operator<<(ostream *o,OscDocFormatter *formatter)

{
  ostream *poVar1;
  long in_RSI;
  ostream *in_RDI;
  char buffer [1024];
  undefined1 local_418 [110];
  undefined1 in_stack_fffffffffffffc56;
  undefined1 in_stack_fffffffffffffc57;
  port_walker_t in_stack_fffffffffffffc58;
  void *in_stack_fffffffffffffc60;
  size_t in_stack_fffffffffffffc68;
  char *in_stack_fffffffffffffc70;
  Ports *in_stack_fffffffffffffc78;
  void *in_stack_fffffffffffffca0;
  
  std::operator<<(in_RDI,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  std::operator<<(in_RDI,"<osc_unit format_version=\"1.0\">\n");
  std::operator<<(in_RDI," <meta>\n");
  poVar1 = std::operator<<(in_RDI,"  <name>");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 8));
  std::operator<<(poVar1,"</name>\n");
  poVar1 = std::operator<<(in_RDI,"  <uri>");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 0x28));
  std::operator<<(poVar1,"</uri>\n");
  poVar1 = std::operator<<(in_RDI,"  <doc_origin>");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 0x48));
  std::operator<<(poVar1,"</doc_origin>\n");
  poVar1 = std::operator<<(in_RDI,"  <author><firstname>");
  std::operator<<(poVar1,(string *)(in_RSI + 0x68));
  poVar1 = std::operator<<(in_RDI,"</firstname><lastname>");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 0x88));
  std::operator<<(poVar1,"</lastname></author>\n");
  std::operator<<(in_RDI," </meta>\n");
  memset(local_418,0,0x400);
  walk_ports(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
             in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,(bool)in_stack_fffffffffffffc57,
             in_stack_fffffffffffffca0,(bool)in_stack_fffffffffffffc56);
  std::operator<<(in_RDI,"</osc_unit>\n");
  return in_RDI;
}

Assistant:

std::ostream &rtosc::operator<<(std::ostream &o, rtosc::OscDocFormatter &formatter)
{
    o << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
    o << "<osc_unit format_version=\"1.0\">\n";
    o << " <meta>\n";
    o << "  <name>" << formatter.prog_name << "</name>\n";
    o << "  <uri>" << formatter.uri << "</uri>\n";
    o << "  <doc_origin>" << formatter.doc_origin << "</doc_origin>\n";
    o << "  <author><firstname>" << formatter.author_first;
    o << "</firstname><lastname>" << formatter.author_last << "</lastname></author>\n";
    o << " </meta>\n";
    char buffer[1024];
    memset(buffer, 0, sizeof(buffer));
    walk_ports(formatter.p, buffer, 1024, &o, dump_ports_cb, false, nullptr, true);
    o << "</osc_unit>\n";
    return o;
}